

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t cfd::core::ConfidentialTxIn::EstimateTxInSize
                   (AddressType addr_type,Script *redeem_script,uint32_t pegin_btc_tx_size,
                   Script *claim_script,bool is_issuance,bool is_blind,uint32_t *witness_area_size,
                   uint32_t *no_witness_area_size,bool is_reissuance,Script *scriptsig_template,
                   int exponent,int minimum_bits,uint32_t *rangeproof_size,uint32_t txoutproof_size)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  undefined3 in_register_00000089;
  byte bVar6;
  uint32_t witness_size;
  uint32_t local_94;
  uint32_t local_90;
  undefined4 local_8c;
  Script *local_88;
  ByteData local_80;
  Script local_68;
  
  local_8c = CONCAT31(in_register_00000089,is_blind);
  local_94 = 0;
  local_90 = 0;
  local_88 = claim_script;
  Script::Script(&local_68,redeem_script);
  TxIn::EstimateTxInSize(addr_type,&local_68,&local_94,&local_90,scriptsig_template);
  Script::~Script(&local_68);
  bVar6 = (byte)local_8c;
  if (is_issuance || is_reissuance) {
    if (bVar6 == 0) {
      local_90 = local_90 + 0x52;
    }
    else {
      local_90 = local_90 + 0x82;
    }
  }
  if (((pegin_btc_tx_size != 0 || is_issuance) || (is_reissuance)) || (local_94 != 0)) {
    if (local_94 == 0) {
      local_94 = 1;
    }
    if (pegin_btc_tx_size != 0) {
      iVar5 = 1;
      iVar4 = 1;
      if ((0x4b < pegin_btc_tx_size) && (iVar4 = 2, 0xff < pegin_btc_tx_size)) {
        iVar4 = (uint)(0xffff < pegin_btc_tx_size) * 2 + 3;
      }
      if ((0x4b < txoutproof_size) && (iVar5 = 2, 0xff < txoutproof_size)) {
        iVar5 = (uint)(0xffff < txoutproof_size) * 2 + 3;
      }
      local_94 = local_94 + iVar4 + pegin_btc_tx_size + iVar5 + txoutproof_size + 0x4c;
      bVar1 = Script::IsEmpty(local_88);
      if (!bVar1) {
        Script::GetData(&local_80,local_88);
        sVar3 = ByteData::GetSerializeSize(&local_80);
        local_94 = local_94 + (int)sVar3;
        if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
    uVar2 = local_94 + 1;
    if (((is_issuance || is_reissuance) & bVar6) == 0) {
      local_94 = local_94 + 3;
    }
    else {
      local_94 = uVar2;
      if ((rangeproof_size == (uint32_t *)0x0) || (uVar2 = *rangeproof_size, uVar2 == 0)) {
        uVar2 = CalculateRangeProofSize(2100000000000000,exponent,minimum_bits);
        uVar2 = uVar2 + 4;
        if (rangeproof_size != (uint32_t *)0x0) {
          *rangeproof_size = uVar2;
        }
      }
      iVar4 = uVar2 * 2;
      if (is_reissuance) {
        iVar4 = uVar2 + 1;
      }
      local_94 = local_94 + iVar4;
    }
  }
  if (witness_area_size != (uint32_t *)0x0) {
    *witness_area_size = local_94;
  }
  if (no_witness_area_size != (uint32_t *)0x0) {
    *no_witness_area_size = local_90;
  }
  return local_94 + local_90;
}

Assistant:

uint32_t ConfidentialTxIn::EstimateTxInSize(
    AddressType addr_type, Script redeem_script, uint32_t pegin_btc_tx_size,
    Script claim_script, bool is_issuance, bool is_blind,
    uint32_t *witness_area_size, uint32_t *no_witness_area_size,
    bool is_reissuance, const Script *scriptsig_template, int exponent,
    int minimum_bits, uint32_t *rangeproof_size, uint32_t txoutproof_size) {
  // TODO(k-matsuzawa): Set amount upper limit and calculate maximum size
  static constexpr const int64_t kIssuanceAmount = kMaxAmount;
  uint32_t witness_size = 0;
  uint32_t size = 0;
  TxIn::EstimateTxInSize(
      addr_type, redeem_script, &witness_size, &size, scriptsig_template);

  if (is_issuance || is_reissuance) {
    if (is_blind) {
      size += kIssuanceBlindSize;
    } else {
      size += kIssuanceAppendSize;
    }
  }

  if ((pegin_btc_tx_size != 0) || is_issuance || is_reissuance ||
      (witness_size != 0)) {
    if (witness_size == 0) {
      witness_size += 1;  // witness size
    }

    if (pegin_btc_tx_size != 0) {
      witness_size += GetSerializedSize(pegin_btc_tx_size) +
                      GetSerializedSize(txoutproof_size) + kPeginWitnessSize;
      if (!claim_script.IsEmpty()) {
        witness_size +=
            static_cast<uint32_t>(claim_script.GetData().GetSerializeSize());
      }
    }
    witness_size += 1;  // pegin witness num

    if ((!is_issuance && !is_reissuance) || !is_blind) {
      witness_size += 2;  // issuance rangeproof size
    } else {
      uint32_t work_proof_size = 0;
      if ((rangeproof_size != nullptr) && (*rangeproof_size != 0)) {
        work_proof_size = *rangeproof_size;
      } else {
        work_proof_size = 4 + CalculateRangeProofSize(
                                  kIssuanceAmount, exponent, minimum_bits);
        if (rangeproof_size != nullptr) *rangeproof_size = work_proof_size;
      }
      if (is_reissuance) {
        work_proof_size += 1;
      } else {
        work_proof_size *= 2;
      }
      witness_size += work_proof_size;
    }
  }

  if (witness_area_size != nullptr) {
    *witness_area_size = witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size = size;
  }
  return size + witness_size;
}